

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

string * __thiscall embree::FileName::base_abi_cxx11_(FileName *this)

{
  long lVar1;
  string *in_RSI;
  string *in_RDI;
  size_t pos;
  
  lVar1 = std::__cxx11::string::find_last_of((char)in_RSI,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string FileName::base() const {
    size_t pos = filename.find_last_of(path_sep);
    if (pos == std::string::npos) return filename;
    return filename.substr(pos+1);
  }